

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseRunner.hpp
# Opt level: O0

void __thiscall Centaurus::BaseRunner::acquire_memory(BaseRunner *this,bool is_allocating)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  size_t __offset;
  int fd;
  bool is_allocating_local;
  BaseRunner *this_local;
  
  iVar1 = 2;
  if (is_allocating) {
    iVar1 = 0x42;
  }
  iVar1 = shm_open(this->m_memory_name,iVar1,0x180);
  sVar2 = get_window_size(this);
  ftruncate(iVar1,sVar2);
  sVar2 = get_sub_window_size(this);
  pvVar3 = mmap((void *)0x0,sVar2,3,1,iVar1,0);
  this->m_sub_window = pvVar3;
  sVar2 = get_main_window_size(this);
  __offset = get_sub_window_size(this);
  pvVar3 = mmap((void *)0x0,sVar2,3,1,iVar1,__offset);
  this->m_main_window = pvVar3;
  if (is_allocating) {
    close(iVar1);
  }
  return;
}

Assistant:

void acquire_memory(bool is_allocating)
  {
#if defined(CENTAURUS_BUILD_WINDOWS)
    m_mem_handle  = (is_allocating) ? CreateFileMappingA(INVALID_HANDLE_VALUE, NULL, PAGE_READWRITE, 0, get_window_size(), m_memory_name)
                                    : OpenFileMappingA(FILE_MAP_ALL_ACCESS, FALSE, m_memory_name);
    m_sub_window  = MapViewOfFile(m_mem_handle, FILE_MAP_ALL_ACCESS, 0, 0, get_sub_window_size());
    m_main_window = MapViewOfFile(m_mem_handle, FILE_MAP_ALL_ACCESS, 0, get_sub_window_size(), get_main_window_size());
#elif defined(CENTAURUS_BUILD_LINUX)
    int fd = shm_open(m_memory_name, (is_allocating) ? O_RDWR | O_CREAT : O_RDWR, 0600);
    ftruncate(fd, get_window_size());
    m_sub_window  = mmap(NULL, get_sub_window_size(), PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    m_main_window = mmap(NULL, get_main_window_size(), PROT_READ | PROT_WRITE, MAP_SHARED, fd, get_sub_window_size());
    if (is_allocating) close(fd);
#endif
  }